

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

LY_ERR lyd_validate_choice_r
                 (lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                 uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  ulong uVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  lysc_node *plVar4;
  lyd_node *plVar5;
  lysc_node *plVar6;
  lysc_node *parent;
  ly_ctx *ctx;
  char *pcVar7;
  lyd_node *node;
  lyd_node *to_del;
  char cVar8;
  uint uVar9;
  lysc_node *plVar10;
  lysc_node *plVar11;
  bool bVar12;
  lysc_node **choices;
  uint32_t local_60;
  LY_ERR local_5c;
  lysc_node *local_58;
  lysc_node *local_50;
  lysc_ext_instance *local_48;
  ulong local_40;
  lysc_node **snodes;
  
  local_60 = int_opts;
  local_48 = ext;
  LVar2 = lyd_val_getnext_get(sparent,mod,ext,(byte)int_opts & 4,getnext_ht,&choices,&snodes);
  if ((LVar2 == LY_SUCCESS) && (choices != (lysc_node **)0x0)) {
    if (*first == (lyd_node *)0x0) {
      LVar2 = LY_SUCCESS;
    }
    else {
      uVar9 = 0;
      LVar2 = LY_SUCCESS;
      do {
        local_40 = (ulong)uVar9;
        plVar11 = choices[local_40];
        if (plVar11 == (lysc_node *)0x0) {
          return LVar2;
        }
        LVar3 = LY_SUCCESS;
        local_5c = LVar2;
        ly_log_location(plVar11,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        parent = *(lysc_node **)(plVar11 + 1);
        local_58 = plVar11;
        if (parent == (lysc_node *)0x0) {
          plVar11 = (lysc_node *)0x0;
          bVar12 = false;
        }
        else {
          plVar4 = (lysc_node *)0x0;
          plVar10 = (lysc_node *)0x0;
          do {
            local_50 = (lysc_node *)0x0;
            cVar8 = '\0';
            plVar5 = lys_getnext_data((lyd_node *)0x0,*first,&local_50,parent,(lysc_module *)0x0);
            if (plVar5 != (lyd_node *)0x0) {
              do {
                if ((plVar5->flags & 4) != 0) {
                  cVar8 = '\x02';
                  goto LAB_001b9df8;
                }
                plVar5 = lys_getnext_data(plVar5,*first,&local_50,parent,(lysc_module *)0x0);
              } while (plVar5 != (lyd_node *)0x0);
              cVar8 = '\x01';
            }
LAB_001b9df8:
            plVar11 = plVar10;
            if (cVar8 == '\x02') {
              plVar6 = parent;
              if (plVar4 != (lysc_node *)0x0) {
                ctx = local_58->module->ctx;
                pcVar7 = plVar4->name;
                goto LAB_001b9f5d;
              }
            }
            else {
              plVar6 = plVar4;
              if ((cVar8 == '\x01') && (plVar11 = parent, plVar10 != (lysc_node *)0x0)) {
                ctx = local_58->module->ctx;
                pcVar7 = plVar10->name;
LAB_001b9f5d:
                ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Data for both cases \"%s\" and \"%s\" exist.",
                        pcVar7,parent->name);
                ly_log_location_revert(1,0,0,0);
                LVar3 = LY_EVALID;
                goto LAB_001b9f9d;
              }
            }
            parent = parent->next;
            plVar4 = plVar6;
            plVar10 = plVar11;
          } while (parent != (lysc_node *)0x0);
          bVar12 = plVar6 != (lysc_node *)0x0;
        }
        ly_log_location_revert(1,0,0,0);
        if ((bool)(plVar11 != (lysc_node *)0x0 & bVar12)) {
          local_50 = (lysc_node *)0x0;
          plVar5 = lys_getnext_data((lyd_node *)0x0,*first,&local_50,plVar11,(lysc_module *)0x0);
          node = (lyd_node *)0x0;
          if (plVar5 != (lyd_node *)0x0) {
            to_del = (lyd_node *)0x0;
            do {
              node = plVar5;
              lyd_del_move_root(first,to_del,mod);
              lyd_free_tree(to_del);
              if ((diff != (lyd_node **)0x0) &&
                 (LVar3 = lyd_val_diff_add(node,LYD_DIFF_OP_DELETE,diff), LVar3 != LY_SUCCESS))
              goto LAB_001b9f9d;
              plVar5 = lys_getnext_data(node,*first,&local_50,plVar11,(lysc_module *)0x0);
              to_del = node;
            } while (plVar5 != (lyd_node *)0x0);
          }
          lyd_del_move_root(first,node,mod);
          lyd_free_tree(node);
          LVar3 = LY_SUCCESS;
        }
LAB_001b9f9d:
        uVar1 = local_40;
        LVar2 = local_5c;
        if (LVar3 != LY_SUCCESS) {
          if (LVar3 != LY_EVALID) {
            return LVar3;
          }
          LVar2 = LY_EVALID;
          if ((val_opts & 4) == 0) {
            return LY_EVALID;
          }
        }
        LVar3 = lyd_validate_choice_r
                          (first,choices[local_40],mod,local_48,val_opts,local_60,getnext_ht,diff);
        if (LVar3 != LY_SUCCESS) {
          if (LVar3 != LY_EVALID) {
            return LVar3;
          }
          LVar2 = LY_EVALID;
          if ((val_opts & 4) == 0) {
            return LY_EVALID;
          }
        }
        uVar9 = (int)uVar1 + 1;
      } while (*first != (lyd_node *)0x0);
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyd_validate_choice_r(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    const struct lysc_node **choices, **snodes;
    uint32_t i;

    /* get cached getnext schema nodes */
    rc = lyd_val_getnext_get(sparent, mod, ext, int_opts & LYD_INTOPT_REPLY, getnext_ht, &choices, &snodes);
    LY_CHECK_GOTO(rc, cleanup);
    if (!choices) {
        goto cleanup;
    }

    for (i = 0; *first && choices[i]; ++i) {
        /* check case duplicites */
        r = lyd_validate_cases(first, mod, (struct lysc_node_choice *)choices[i], diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

        /* check for nested choice */
        r = lyd_validate_choice_r(first, choices[i], mod, ext, val_opts, int_opts, getnext_ht, diff);
        LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);
    }

cleanup:
    return rc;
}